

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_weighted<float,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,
               robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *w)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  float *pfVar11;
  long lVar12;
  ulong *puVar13;
  ulong *key;
  int *piVar14;
  long lVar15;
  size_t row;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar16;
  longdouble lVar17;
  double dVar18;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar19;
  tuple<> local_c9;
  longdouble local_c8;
  longdouble local_b8;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a8;
  float *local_a0;
  longdouble local_98;
  int *local_88;
  ulong *local_80;
  longdouble local_78;
  longdouble local_6c;
  size_t *local_60;
  ulong local_58;
  longdouble local_48;
  longdouble local_3c;
  
  lVar10 = (long)Xc_indptr[col_num];
  lVar12 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
  }
  else {
    puVar13 = ix_arr + st;
    local_98 = (longdouble)CONCAT28(local_98._8_2_,ix_arr);
    local_80 = ix_arr + end + 1;
    uVar5 = (long)local_80 - (long)puVar13 >> 3;
    key = puVar13;
    if (0 < (long)uVar5) {
      do {
        uVar6 = uVar5 >> 1;
        uVar7 = ~uVar6 + uVar5;
        uVar5 = uVar6;
        if (key[uVar6] < (ulong)(long)Xc_ind[lVar10]) {
          key = key + uVar6 + 1;
          uVar5 = uVar7;
        }
      } while (0 < (long)uVar5);
    }
    local_b8 = (longdouble)CONCAT28(local_b8._8_2_,lVar10);
    local_c8 = (longdouble)CONCAT28(local_c8._8_2_,lVar12);
    local_58 = (ulong)Xc_ind[lVar12 + -1];
    local_78 = (longdouble)0;
    local_a0 = Xc;
    local_88 = Xc_ind;
    psVar4 = ix_arr;
    if (st <= end) {
      local_78 = (longdouble)0;
      do {
        local_a8._M_head_impl = puVar13;
        pVar19 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,puVar13,(piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a8,&local_c9);
        local_78 = local_78 + (longdouble)*(double *)((pVar19.first.m_bucket.m_bucket)->m_value + 8)
        ;
        st = st + 1;
        puVar13 = puVar13 + 1;
        lVar12 = local_c8._0_8_;
        lVar10 = local_b8._0_8_;
        psVar4 = local_98._0_8_;
      } while (st <= end);
    }
    local_98._0_8_ = psVar4;
    local_b8._0_8_ = lVar10;
    local_c8._0_8_ = lVar12;
    piVar3 = local_88;
    lVar12 = local_c8._0_8_;
    if ((key == local_80) || (lVar10 = local_c8._0_8_ + -1, local_c8._0_8_ == local_b8._0_8_)) {
      local_b8 = (longdouble)0;
      local_6c = local_b8;
      local_c8 = local_b8;
    }
    else {
      local_60 = local_98._0_8_ + end;
      local_98 = (longdouble)0;
      lVar15 = local_b8._0_8_;
      piVar9 = local_88;
      pfVar11 = local_a0;
      puVar13 = local_80;
      local_b8 = local_98;
      local_6c = local_98;
      local_c8 = local_98;
      while (uVar5 = *key, uVar5 <= local_58) {
        piVar14 = piVar9 + lVar15;
        iVar1 = *piVar14;
        if (iVar1 == (int)uVar5) {
          local_a8._M_head_impl = key;
          if ((uint)ABS(pfVar11[lVar15]) < 0x7f800000) {
            pVar19 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_c9);
            local_3c = (longdouble)*(double *)((pVar19.first.m_bucket.m_bucket)->m_value + 8);
            if ((local_c8 == (longdouble)0) && (!NAN(local_c8) && !NAN((longdouble)0))) {
              local_98 = (longdouble)local_a0[lVar15];
            }
            local_c8 = local_c8 + local_3c;
            local_48 = (longdouble)local_a0[lVar15];
            lVar16 = in_ST2;
            lVar17 = in_ST2;
            fmal();
            local_b8 = in_ST0;
            fmal();
            local_98 = local_b8;
            local_6c = in_ST1;
            in_ST0 = in_ST2;
            in_ST1 = lVar16;
            in_ST2 = lVar17;
          }
          else {
            pVar19 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,key,(piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_c9);
            local_78 = local_78 -
                       (longdouble)*(double *)((pVar19.first.m_bucket.m_bucket)->m_value + 8);
          }
          if ((key == local_60) || (lVar15 == lVar10)) break;
          piVar14 = piVar14 + 1;
          key = key + 1;
          uVar5 = (long)piVar3 + (lVar12 * 4 - (long)piVar14) >> 2;
          if (0 < (long)uVar5) {
            do {
              uVar6 = uVar5 >> 1;
              uVar7 = ~uVar6 + uVar5;
              uVar5 = uVar6;
              if ((ulong)(long)(piVar14 + uVar6 + 1)[-1] < *key) {
                piVar14 = piVar14 + uVar6 + 1;
                uVar5 = uVar7;
              }
            } while (0 < (long)uVar5);
          }
          lVar15 = (long)piVar14 - (long)local_88 >> 2;
          piVar9 = local_88;
          pfVar11 = local_a0;
          puVar13 = local_80;
        }
        else if ((int)uVar5 < iVar1) {
          key = key + 1;
          uVar5 = (long)puVar13 - (long)key >> 3;
          while (0 < (long)uVar5) {
            uVar6 = uVar5 >> 1;
            uVar7 = ~uVar6 + uVar5;
            uVar5 = uVar6;
            if (key[uVar6] < (ulong)(long)iVar1) {
              key = key + uVar6 + 1;
              uVar5 = uVar7;
            }
          }
        }
        else {
          piVar2 = piVar14 + 1;
          uVar6 = (long)piVar3 + (lVar12 * 4 - (long)(piVar14 + 1)) >> 2;
          while (0 < (long)uVar6) {
            uVar7 = uVar6 >> 1;
            uVar8 = ~uVar7 + uVar6;
            uVar6 = uVar7;
            if ((ulong)(long)(piVar2 + uVar7 + 1)[-1] < uVar5) {
              piVar2 = piVar2 + uVar7 + 1;
              uVar6 = uVar8;
            }
          }
          lVar15 = (long)piVar2 - (long)piVar9 >> 2;
        }
        if ((key == puVar13) || (lVar15 == lVar12)) break;
      }
    }
    if ((local_c8 != (longdouble)0) || (NAN(local_c8) || NAN((longdouble)0))) {
      if (local_c8 < local_78) {
        local_6c = local_b8 * local_b8 * ((longdouble)1 - local_c8 / local_78) * local_c8 + local_6c
        ;
        local_b8 = local_b8 * (local_c8 / local_78);
      }
      *x_mean = (double)local_b8;
      dVar18 = (double)SQRT(local_6c / local_78);
    }
    else {
      *x_mean = 0.0;
      dVar18 = 0.0;
    }
    *x_sd = dVar18;
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}